

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferBase.hpp
# Opt level: O0

void __thiscall
Diligent::BufferBase<Diligent::EngineGLImplTraits>::BufferBase
          (BufferBase<Diligent::EngineGLImplTraits> *this,IReferenceCounters *pRefCounters,
          TBuffViewObjAllocator *BuffViewObjAllocator,RenderDeviceImplType *pDevice,
          BufferDesc *BuffDesc,bool bIsDeviceInternal)

{
  Uint32 UVar1;
  RenderDeviceGLImpl *pRVar2;
  Char *Message;
  char (*in_stack_ffffffffffffff00) [35];
  size_t local_88;
  undefined1 local_80 [8];
  string msg;
  Uint64 DeviceQueuesMask;
  STDDeleter<Diligent::BufferViewGLImpl,_Diligent::FixedBlockMemoryAllocator> local_48;
  STDDeleter<Diligent::BufferViewGLImpl,_Diligent::FixedBlockMemoryAllocator> local_40;
  undefined1 local_31;
  BufferDesc *pBStack_30;
  bool bIsDeviceInternal_local;
  BufferDesc *BuffDesc_local;
  RenderDeviceImplType *pDevice_local;
  TBuffViewObjAllocator *BuffViewObjAllocator_local;
  IReferenceCounters *pRefCounters_local;
  BufferBase<Diligent::EngineGLImplTraits> *this_local;
  
  local_31 = bIsDeviceInternal;
  pBStack_30 = BuffDesc;
  BuffDesc_local = (BufferDesc *)pDevice;
  pDevice_local = (RenderDeviceImplType *)BuffViewObjAllocator;
  BuffViewObjAllocator_local = (TBuffViewObjAllocator *)pRefCounters;
  pRefCounters_local = (IReferenceCounters *)this;
  DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>::
  DeviceObjectBase(&this->
                    super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                   ,pRefCounters,pDevice,BuffDesc,bIsDeviceInternal);
  (this->
  super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>).
  super_ObjectBase<Diligent::IBufferGL>.super_RefCountedObject<Diligent::IBufferGL>.super_IBufferGL.
  super_IBuffer.super_IDeviceObject.super_IObject = (IObject)&PTR_QueryInterface_0058d1c8;
  this->m_dbgBuffViewAllocator = (TBuffViewObjAllocator *)pDevice_local;
  this->m_State = RESOURCE_STATE_UNKNOWN;
  this->m_MemoryProperties = MEMORY_PROPERTY_UNKNOWN;
  this->m_DynamicBufferId = 0xffffffff;
  STDDeleter<Diligent::BufferViewGLImpl,_Diligent::FixedBlockMemoryAllocator>::STDDeleter
            (&local_40,(FixedBlockMemoryAllocator *)pDevice_local);
  std::
  unique_ptr<Diligent::BufferViewGLImpl,Diligent::STDDeleter<Diligent::BufferViewGLImpl,Diligent::FixedBlockMemoryAllocator>>
  ::
  unique_ptr<Diligent::STDDeleter<Diligent::BufferViewGLImpl,Diligent::FixedBlockMemoryAllocator>,void>
            ((unique_ptr<Diligent::BufferViewGLImpl,Diligent::STDDeleter<Diligent::BufferViewGLImpl,Diligent::FixedBlockMemoryAllocator>>
              *)&this->m_pDefaultUAV,(pointer)0x0,&local_40);
  STDDeleter<Diligent::BufferViewGLImpl,_Diligent::FixedBlockMemoryAllocator>::STDDeleter
            (&local_48,(FixedBlockMemoryAllocator *)pDevice_local);
  std::
  unique_ptr<Diligent::BufferViewGLImpl,Diligent::STDDeleter<Diligent::BufferViewGLImpl,Diligent::FixedBlockMemoryAllocator>>
  ::
  unique_ptr<Diligent::STDDeleter<Diligent::BufferViewGLImpl,Diligent::FixedBlockMemoryAllocator>,void>
            ((unique_ptr<Diligent::BufferViewGLImpl,Diligent::STDDeleter<Diligent::BufferViewGLImpl,Diligent::FixedBlockMemoryAllocator>>
              *)&this->m_pDefaultSRV,(pointer)0x0,&local_48);
  pRVar2 = DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
           ::GetDevice(&this->
                        super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                      );
  ValidateBufferDesc(&(this->
                      super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                      ).m_Desc,(IRenderDevice *)pRVar2);
  pRVar2 = DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
           ::GetDevice(&this->
                        super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                      );
  msg.field_2._8_8_ = RenderDeviceGLImpl::GetCommandQueueMask(pRVar2);
  if (((this->
       super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
       ).m_Desc.ImmediateContextMask & msg.field_2._8_8_) == 0) {
    pRVar2 = DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
             ::GetDevice(&this->
                          super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                        );
    local_88 = RenderDeviceGLImpl::GetCommandQueueCount(pRVar2);
    FormatString<char[42],std::ios_base&(std::ios_base&),unsigned_long,char[24],unsigned_long,char[35]>
              ((string *)local_80,(Diligent *)"No bits in the immediate context mask (0x",
               (char (*) [42])std::hex,
               (_func_ios_base_ptr_ios_base_ptr *)
               &(this->
                super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                ).m_Desc.ImmediateContextMask,(unsigned_long *)") correspond to one of ",
               (char (*) [24])&local_88,(unsigned_long *)" available software command queues",
               in_stack_ffffffffffffff00);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"BufferBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/BufferBase.hpp"
               ,0x66);
    std::__cxx11::string::~string((string *)local_80);
  }
  (this->
  super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>).
  m_Desc.ImmediateContextMask =
       msg.field_2._8_8_ &
       (this->
       super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
       ).m_Desc.ImmediateContextMask;
  if ((this->
      super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
      ).m_Desc.Usage == USAGE_DYNAMIC) {
    UVar1 = RenderDeviceBase<Diligent::EngineGLImplTraits>::AllocateDynamicBufferId
                      ((RenderDeviceBase<Diligent::EngineGLImplTraits> *)BuffDesc_local);
    this->m_DynamicBufferId = UVar1;
  }
  return;
}

Assistant:

BufferBase(IReferenceCounters*    pRefCounters,
               TBuffViewObjAllocator& BuffViewObjAllocator,
               RenderDeviceImplType*  pDevice,
               const BufferDesc&      BuffDesc,
               bool                   bIsDeviceInternal) :
        TDeviceObjectBase{pRefCounters, pDevice, BuffDesc, bIsDeviceInternal},
#ifdef DILIGENT_DEBUG
        m_dbgBuffViewAllocator{BuffViewObjAllocator},
#endif
        m_pDefaultUAV{nullptr, STDDeleter<BufferViewImplType, TBuffViewObjAllocator>(BuffViewObjAllocator)},
        m_pDefaultSRV{nullptr, STDDeleter<BufferViewImplType, TBuffViewObjAllocator>(BuffViewObjAllocator)}
    {
        ValidateBufferDesc(this->m_Desc, this->GetDevice()); // May throw

        Uint64 DeviceQueuesMask = this->GetDevice()->GetCommandQueueMask();
        DEV_CHECK_ERR((this->m_Desc.ImmediateContextMask & DeviceQueuesMask) != 0,
                      "No bits in the immediate context mask (0x", std::hex, this->m_Desc.ImmediateContextMask,
                      ") correspond to one of ", this->GetDevice()->GetCommandQueueCount(), " available software command queues");
        this->m_Desc.ImmediateContextMask &= DeviceQueuesMask;

        if (this->m_Desc.Usage == USAGE_DYNAMIC)
        {
            m_DynamicBufferId = pDevice->AllocateDynamicBufferId();
        }
    }